

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mismatch_suite.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  test_null();
  test_boolean();
  test_integer();
  test_real();
  test_string();
  test_wstring();
  test_u16string();
  test_u32string();
  test_array();
  test_map();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    // Illegal to compare larger container with smaller container, so
    // comparing null with any other type is fine, but comparing any other
    // type with null is illegal.

    test_null();
    test_boolean();
    test_integer();
    test_real();
    test_string();
    test_wstring();
    test_u16string();
    test_u32string();
    test_array();
    test_map();

    return boost::report_errors();
}